

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.cc
# Opt level: O0

bool __thiscall
testing::internal::UnorderedElementsAreMatcherImplBase::FindPairing
          (UnorderedElementsAreMatcherImplBase *this,MatchMatrix *matrix,
          MatchResultListener *listener)

{
  ulong uVar1;
  bool bVar2;
  Flags FVar3;
  size_t sVar4;
  MatchResultListener *pMVar5;
  ostream *poVar6;
  size_type sVar7;
  reference pvVar8;
  ulong local_80;
  size_t mi;
  char *sep;
  undefined4 local_64;
  size_t local_60 [3];
  ulong local_48;
  size_t max_flow;
  ElementMatcherPairs matches;
  MatchResultListener *listener_local;
  MatchMatrix *matrix_local;
  UnorderedElementsAreMatcherImplBase *this_local;
  
  matches.
  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)listener;
  FindMaxBipartiteMatching((ElementMatcherPairs *)&max_flow,matrix);
  local_48 = std::
             vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ::size((ElementMatcherPairs *)&max_flow);
  FVar3 = match_flags(this);
  uVar1 = local_48;
  if (((FVar3 & Superset) == 0) || (sVar4 = MatchMatrix::RhsSize(matrix), sVar4 <= uVar1)) {
    FVar3 = match_flags(this);
    uVar1 = local_48;
    if (((FVar3 & Subset) == 0) || (sVar4 = MatchMatrix::LhsSize(matrix), sVar4 <= uVar1)) {
      sVar7 = std::
              vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                      *)&max_flow);
      if ((1 < sVar7) &&
         (bVar2 = MatchResultListener::IsInterested
                            ((MatchResultListener *)
                             matches.
                             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage), bVar2)) {
        mi = (size_t)anon_var_dwarf_10c7af;
        for (local_80 = 0;
            sVar7 = std::
                    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                    ::size((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            *)&max_flow), local_80 < sVar7; local_80 = local_80 + 1) {
          pMVar5 = MatchResultListener::operator<<
                             ((MatchResultListener *)
                              matches.
                              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,(char **)&mi);
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [13])" - element #");
          pvVar8 = std::
                   vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 *)&max_flow,local_80);
          pMVar5 = MatchResultListener::operator<<(pMVar5,&pvVar8->first);
          pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [25])" is matched by matcher #")
          ;
          pvVar8 = std::
                   vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                   ::operator[]((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                                 *)&max_flow,local_80);
          MatchResultListener::operator<<(pMVar5,&pvVar8->second);
          mi = (long)"\",\n" + 1;
        }
      }
      this_local._7_1_ = true;
    }
    else {
      bVar2 = MatchResultListener::IsInterested
                        ((MatchResultListener *)
                         matches.
                         super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar2) {
        pMVar5 = MatchResultListener::operator<<
                           ((MatchResultListener *)
                            matches.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (char (*) [65])
                            "where not all elements can be matched, and the closest match is ");
        pMVar5 = MatchResultListener::operator<<(pMVar5,&local_48);
        pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [5])0x1ea27c);
        sep = (char *)MatchMatrix::RhsSize(matrix);
        pMVar5 = MatchResultListener::operator<<(pMVar5,(unsigned_long *)&sep);
        MatchResultListener::operator<<(pMVar5,(char (*) [30])" matchers with the pairings:\n");
        poVar6 = MatchResultListener::stream
                           ((MatchResultListener *)
                            matches.
                            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        LogElementMatcherPairVec((ElementMatcherPairs *)&max_flow,poVar6);
      }
      this_local._7_1_ = false;
    }
  }
  else {
    bVar2 = MatchResultListener::IsInterested
                      ((MatchResultListener *)
                       matches.
                       super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      pMVar5 = MatchResultListener::operator<<
                         ((MatchResultListener *)
                          matches.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                          (char (*) [89])
                          "where no permutation of the elements can satisfy all matchers, and the closest match is "
                         );
      pMVar5 = MatchResultListener::operator<<(pMVar5,&local_48);
      pMVar5 = MatchResultListener::operator<<(pMVar5,(char (*) [5])0x1ea27c);
      local_60[0] = MatchMatrix::RhsSize(matrix);
      pMVar5 = MatchResultListener::operator<<(pMVar5,local_60);
      MatchResultListener::operator<<(pMVar5,(char (*) [30])" matchers with the pairings:\n");
      poVar6 = MatchResultListener::stream
                         ((MatchResultListener *)
                          matches.
                          super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
      LogElementMatcherPairVec((ElementMatcherPairs *)&max_flow,poVar6);
    }
    this_local._7_1_ = false;
  }
  local_64 = 1;
  std::
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             *)&max_flow);
  return this_local._7_1_;
}

Assistant:

bool UnorderedElementsAreMatcherImplBase::FindPairing(
    const MatchMatrix& matrix, MatchResultListener* listener) const {
  ElementMatcherPairs matches = FindMaxBipartiteMatching(matrix);

  size_t max_flow = matches.size();
  if ((match_flags() & UnorderedMatcherRequire::Superset) &&
      max_flow < matrix.RhsSize()) {
    if (listener->IsInterested()) {
      *listener << "where no permutation of the elements can satisfy all "
                   "matchers, and the closest match is "
                << max_flow << " of " << matrix.RhsSize()
                << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }
  if ((match_flags() & UnorderedMatcherRequire::Subset) &&
      max_flow < matrix.LhsSize()) {
    if (listener->IsInterested()) {
      *listener
          << "where not all elements can be matched, and the closest match is "
          << max_flow << " of " << matrix.RhsSize()
          << " matchers with the pairings:\n";
      LogElementMatcherPairVec(matches, listener->stream());
    }
    return false;
  }

  if (matches.size() > 1) {
    if (listener->IsInterested()) {
      const char* sep = "where:\n";
      for (size_t mi = 0; mi < matches.size(); ++mi) {
        *listener << sep << " - element #" << matches[mi].first
                  << " is matched by matcher #" << matches[mi].second;
        sep = ",\n";
      }
    }
  }
  return true;
}